

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  size_type *psVar1;
  InternalRunDeathTestFlag *pIVar2;
  undefined1 *puVar3;
  string *psVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  DeathTest *this_00;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  int death_test_index;
  int local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  RE *local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  string local_98;
  int local_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_e0 = regex;
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  iVar5 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  iVar6 = iVar5 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ = iVar6;
  local_104 = iVar6;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    if (pIVar2->index_ <= iVar5) {
      StreamableToString<int>(&local_50,&local_104);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x73714d);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar7;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_a8 = *puVar10;
        lStack_a0 = plVar7[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar10;
        local_b8 = (ulong *)*plVar7;
      }
      local_b0 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_74 = pIVar2->index_;
      StreamableToString<int>(&local_98,&local_74);
      uVar11 = 0xf;
      if (local_b8 != &local_a8) {
        uVar11 = local_a8;
      }
      if (uVar11 < local_98._M_string_length + local_b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          uVar12 = local_98.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_98._M_string_length + local_b0) goto LAB_00325651;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_00325651:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p)
        ;
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar1 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_100.field_2._M_allocated_capacity = *psVar1;
        local_100.field_2._8_8_ = puVar8[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar1;
        local_100._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_100._M_string_length = puVar8[1];
      *puVar8 = psVar1;
      puVar8[1] = 0;
      *(undefined1 *)psVar1 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_c8 = *plVar7;
        lStack_c0 = puVar8[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar7;
        local_d8 = (long *)*puVar8;
      }
      local_d0 = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      psVar4 = &local_50;
      goto LAB_0032580e;
    }
    iVar5 = std::__cxx11::string::compare((char *)pIVar2);
    if (((iVar5 != 0) || (pIVar2->line_ != line)) || (pIVar2->index_ != iVar6)) {
      *test = (DeathTest *)0x0;
      return true;
    }
  }
  iVar6 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
  if (iVar6 == 0) {
    this_00 = (DeathTest *)operator_new(0x40);
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[2]._vptr_DeathTest = (_func_int **)local_e0;
    *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_008da320;
    this_00[6]._vptr_DeathTest = (_func_int **)file;
    *(int *)&this_00[7]._vptr_DeathTest = line;
  }
  else {
    iVar6 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
    if (iVar6 != 0) {
      std::operator+(&local_100,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_c8 = *plVar9;
        lStack_c0 = plVar7[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar9;
        local_d8 = (long *)*plVar7;
      }
      local_d0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      psVar4 = &local_100;
LAB_0032580e:
      puVar3 = (undefined1 *)(&(psVar4->field_2)._M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar3 != &psVar4->field_2) {
        operator_delete(puVar3);
      }
      return false;
    }
    this_00 = (DeathTest *)operator_new(0x30);
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[2]._vptr_DeathTest = (_func_int **)local_e0;
    *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_008da2c8;
  }
  *test = this_00;
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }